

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marshalling.cc
# Opt level: O0

bool absl::lts_20240722::flags_internal::ParseFlagImpl<unsigned_int>(string_view text,uint *dst)

{
  bool bVar1;
  uint uVar2;
  int in_R8D;
  string_view sVar3;
  string_view s;
  undefined8 local_30;
  uint *dst_local;
  string_view text_local;
  
  sVar3 = StripAsciiWhitespace(text);
  local_30 = (flags_internal *)sVar3._M_len;
  sVar3._M_len = (size_t)sVar3._M_str;
  uVar2 = NumericBase(local_30,sVar3);
  s._M_str = (char *)dst;
  s._M_len = (size_t)sVar3._M_str;
  bVar1 = numbers_internal::safe_strtoi_base<unsigned_int>
                    ((numbers_internal *)local_30,s,(Nonnull<unsigned_int_*>)(ulong)uVar2,in_R8D);
  return bVar1;
}

Assistant:

inline bool ParseFlagImpl(absl::string_view text, IntType& dst) {
  text = absl::StripAsciiWhitespace(text);

  return absl::numbers_internal::safe_strtoi_base(text, &dst,
                                                  NumericBase(text));
}